

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

__pid_t __thiscall CSemaphore::wait(CSemaphore *this,void *__stat_loc)

{
  long lVar1;
  long in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd8,(mutex_type *)this);
  std::condition_variable::wait<CSemaphore::wait()::_lambda()_1_>
            (&this->condition,in_stack_ffffffffffffffc8,(anon_class_8_1_8991fb9c)this);
  this->value = this->value + -1;
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__pid_t)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void wait() noexcept
    {
        std::unique_lock<std::mutex> lock(mutex);
        condition.wait(lock, [&]() { return value >= 1; });
        value--;
    }